

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O1

void ihevcd_bits_flush_to_byte_boundary(bitstrm_t *ps_bitstrm)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  
  uVar3 = ps_bitstrm->u4_bit_ofst & 0xfffffff8;
  uVar1 = uVar3 + 8;
  ps_bitstrm->u4_bit_ofst = uVar1;
  if (0x1f < uVar1) {
    ps_bitstrm->u4_cur_word = ps_bitstrm->u4_nxt_word;
    puVar2 = ps_bitstrm->pu4_buf;
    ps_bitstrm->pu4_buf = puVar2 + 1;
    uVar1 = *puVar2;
    ps_bitstrm->u4_bit_ofst = uVar3 - 0x18;
    ps_bitstrm->u4_nxt_word =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  return;
}

Assistant:

void ihevcd_bits_flush_to_byte_boundary(bitstrm_t *ps_bitstrm)
{
    UWORD32 u4_numbits;
    u4_numbits = (ps_bitstrm->u4_bit_ofst) & 7;

    u4_numbits = 8 - u4_numbits;

    BITS_FLUSH(ps_bitstrm->pu4_buf,
               ps_bitstrm->u4_bit_ofst,
               ps_bitstrm->u4_cur_word,
               ps_bitstrm->u4_nxt_word,
               u4_numbits);

    return;
}